

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O2

bool __thiscall
wallet::DescriptorScriptPubKeyMan::SignTransaction
          (DescriptorScriptPubKeyMan *this,CMutableTransaction *tx,
          map<COutPoint,_Coin,_std::less<COutPoint>,_std::allocator<std::pair<const_COutPoint,_Coin>_>_>
          *coins,int sighash,
          map<int,_bilingual_str,_std::less<int>,_std::allocator<std::pair<const_int,_bilingual_str>_>_>
          *input_errors)

{
  long lVar1;
  bool bVar2;
  _Base_ptr p_Var3;
  long in_FS_OFFSET;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> coin_keys;
  unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_> keys;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::make_unique<FlatSigningProvider>();
  for (p_Var3 = (coins->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var3 != &(coins->_M_t)._M_impl.super__Rb_tree_header;
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)p_Var3)) {
    GetSigningProvider((DescriptorScriptPubKeyMan *)&coin_keys,(CScript *)this,
                       (bool)((char)p_Var3 + 'P'));
    if ((__uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>)
        coin_keys._M_t.
        super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>._M_t.
        super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>.
        super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl !=
        (__uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>)0x0) {
      FlatSigningProvider::Merge
                ((FlatSigningProvider *)
                 keys._M_t.
                 super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                 .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl,
                 (FlatSigningProvider *)
                 coin_keys._M_t.
                 super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                 .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl);
    }
    std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
              (&coin_keys);
  }
  bVar2 = ::SignTransaction(tx,(SigningProvider *)
                               keys._M_t.
                               super___uniq_ptr_impl<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_FlatSigningProvider_*,_std::default_delete<FlatSigningProvider>_>
                               .super__Head_base<0UL,_FlatSigningProvider_*,_false>._M_head_impl,
                            coins,sighash,input_errors);
  std::unique_ptr<FlatSigningProvider,_std::default_delete<FlatSigningProvider>_>::~unique_ptr
            (&keys);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool DescriptorScriptPubKeyMan::SignTransaction(CMutableTransaction& tx, const std::map<COutPoint, Coin>& coins, int sighash, std::map<int, bilingual_str>& input_errors) const
{
    std::unique_ptr<FlatSigningProvider> keys = std::make_unique<FlatSigningProvider>();
    for (const auto& coin_pair : coins) {
        std::unique_ptr<FlatSigningProvider> coin_keys = GetSigningProvider(coin_pair.second.out.scriptPubKey, true);
        if (!coin_keys) {
            continue;
        }
        keys->Merge(std::move(*coin_keys));
    }

    return ::SignTransaction(tx, keys.get(), coins, sighash, input_errors);
}